

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_traits.h
# Opt level: O0

void lzham::helpers::construct_array<lzham::adaptive_bit_model>(adaptive_bit_model *p,uint n)

{
  uint in_ESI;
  long in_RDI;
  adaptive_bit_model *q;
  undefined8 local_8;
  
  for (local_8 = in_RDI; local_8 != in_RDI + (ulong)in_ESI * 2; local_8 = local_8 + 2) {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x13fd65);
  }
  return;
}

Assistant:

inline void construct_array(T* p, uint n)
      {
         if (LZHAM_IS_SCALAR_TYPE(T))
         {
            memset(p, 0, sizeof(T) * n);
         }
         else
         {
            T* q = p + n;
            for ( ; p != q; ++p)
               new (static_cast<void*>(p)) T;
         }
      }